

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O1

void __thiscall cmOrderDirectories::DiagnoseCycle(cmOrderDirectories *this)

{
  pointer pbVar1;
  cmOrderDirectoriesConstraint *pcVar2;
  cmake *this_00;
  ostream *poVar3;
  string *psVar4;
  ulong uVar5;
  ulong uVar6;
  pointer ppVar7;
  ostringstream e;
  pointer local_1f8;
  string local_1e8;
  cmListFileBacktrace local_1c8;
  undefined1 local_1a8 [376];
  
  if (this->CycleDiagnosed == false) {
    this->CycleDiagnosed = true;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Cannot generate a safe ",0x17);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(this->Purpose)._M_dataplus._M_p,
                        (this->Purpose)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," for target ",0xc);
    psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," because there is a cycle in the constraint graph:\n",0x33);
    local_1f8 = (this->ConflictGraph).
                super__Vector_base<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>
                ._M_impl.super__Vector_impl_data._M_start;
    if ((this->ConflictGraph).
        super__Vector_base<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>
        ._M_impl.super__Vector_impl_data._M_finish != local_1f8) {
      uVar6 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  dir ",6);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," is [",5);
        pbVar1 = (this->OriginalDirectories).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,pbVar1[uVar6]._M_dataplus._M_p,pbVar1[uVar6]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]\n",2);
        for (ppVar7 = local_1f8[uVar6].
                      super_vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppVar7 != local_1f8[uVar6].
                      super_vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish; ppVar7 = ppVar7 + 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    dir ",8);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,ppVar7->first);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," must precede it due to ",0x18)
          ;
          pcVar2 = (this->ConstraintEntries).
                   super__Vector_base<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[ppVar7->second];
          (*pcVar2->_vptr_cmOrderDirectoriesConstraint[2])(pcVar2,(ostream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
        }
        uVar6 = (ulong)((int)uVar6 + 1);
        local_1f8 = (this->ConflictGraph).
                    super__Vector_base<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        uVar5 = ((long)(this->ConflictGraph).
                       super__Vector_base<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)local_1f8 >> 3) *
                -0x5555555555555555;
      } while (uVar6 <= uVar5 && uVar5 - uVar6 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Some of these libraries may not be found correctly.",0x33);
    this_00 = this->GlobalGenerator->CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmGeneratorTarget::GetBacktrace(&local_1c8,this->Target);
    cmake::IssueMessage(this_00,WARNING,&local_1e8,&local_1c8);
    cmListFileBacktrace::~cmListFileBacktrace(&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  return;
}

Assistant:

void cmOrderDirectories::DiagnoseCycle()
{
  // Report the cycle at most once.
  if (this->CycleDiagnosed) {
    return;
  }
  this->CycleDiagnosed = true;

  // Construct the message.
  std::ostringstream e;
  e << "Cannot generate a safe " << this->Purpose << " for target "
    << this->Target->GetName()
    << " because there is a cycle in the constraint graph:\n";

  // Display the conflict graph.
  for (unsigned int i = 0; i < this->ConflictGraph.size(); ++i) {
    ConflictList const& clist = this->ConflictGraph[i];
    e << "  dir " << i << " is [" << this->OriginalDirectories[i] << "]\n";
    for (ConflictList::const_iterator j = clist.begin(); j != clist.end();
         ++j) {
      e << "    dir " << j->first << " must precede it due to ";
      this->ConstraintEntries[j->second]->Report(e);
      e << "\n";
    }
  }
  e << "Some of these libraries may not be found correctly.";
  this->GlobalGenerator->GetCMakeInstance()->IssueMessage(
    cmake::WARNING, e.str(), this->Target->GetBacktrace());
}